

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O2

int libpd_aftertouch(int channel,int value)

{
  if (0x7f < (uint)value || channel < 0) {
    return -1;
  }
  sys_lock();
  inmidi_aftertouch((uint)channel >> 4,channel & 0xf,value);
  sys_unlock();
  return 0;
}

Assistant:

int libpd_aftertouch(int channel, int value) {
  CHECK_CHANNEL
  CHECK_RANGE_7BIT(value)
  sys_lock();
  inmidi_aftertouch(PORT, CHANNEL, value);
  sys_unlock();
  return 0;
}